

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall
FIX::Session::nextResendRequest(Session *this,Message *resendRequest,UtcTimeStamp *timeStamp)

{
  SessionState *this_00;
  char *pcVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  DataDictionary *dataDictionary;
  DataDictionary *applicationDataDictionary;
  message_order *pmVar11;
  message_order *pmVar12;
  message_order *pmVar13;
  Message *this_01;
  void *pvVar14;
  string *psVar15;
  _func_int **pp_Var16;
  signed_int value;
  signed_int value_00;
  signed_int value_01;
  _Alloc_hider _Var17;
  undefined8 uVar18;
  uchar *in_R8;
  size_t in_R9;
  int local_4a4;
  string *local_490;
  string strMsgType;
  EndSeqNo endSeqNo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  string beginString;
  MsgSeqNum msgSeqNum;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  char local_330 [16];
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  size_t local_300;
  int local_2f8;
  _func_int **local_2f0;
  Message *local_2e8;
  undefined **local_2e0;
  DataDictionary *local_2d8;
  SessionID *local_2d0;
  string messageString;
  ApplVerID applVerID;
  Message msg;
  MsgType msgType;
  BeginSeqNo beginSeqNo;
  
  iVar5 = verify(this,(EVP_PKEY_CTX *)resendRequest,(uchar *)0x0,0,in_R8,in_R9);
  if ((char)iVar5 == '\0') {
    return;
  }
  Mutex::lock(&this->m_mutex);
  IntField::IntField(&beginSeqNo.super_SeqNumField,7);
  local_2f0 = (_func_int **)&PTR__FieldBase_001eef70;
  beginSeqNo.super_SeqNumField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001eef70;
  IntField::IntField(&endSeqNo.super_SeqNumField,0x10);
  endSeqNo.super_SeqNumField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001eefa8;
  FieldMap::getField(&resendRequest->super_FieldMap,(FieldBase *)&beginSeqNo);
  FieldMap::getField(&resendRequest->super_FieldMap,(FieldBase *)&endSeqNo);
  uVar6 = IntField::getValue(&beginSeqNo.super_SeqNumField);
  IntConvertor::convert_abi_cxx11_((string *)&applVerID,(IntConvertor *)(ulong)uVar6,value);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&applVerID,0,(char *)0x0,0x1c7d9f);
  psVar15 = &msgType.super_StringField.super_FieldBase.m_string;
  pp_Var16 = (_func_int **)(plVar9 + 2);
  if ((_func_int **)*plVar9 == pp_Var16) {
    msgType.super_StringField.super_FieldBase.m_string._M_dataplus._M_p = (pointer)*pp_Var16;
    msgType.super_StringField.super_FieldBase.m_string._M_string_length = plVar9[3];
    msgType.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar15;
  }
  else {
    msgType.super_StringField.super_FieldBase.m_string._M_dataplus._M_p = (pointer)*pp_Var16;
    msgType.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)*plVar9;
  }
  msgType.super_StringField.super_FieldBase._8_8_ = plVar9[1];
  *plVar9 = (long)pp_Var16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_2e8 = resendRequest;
  plVar9 = (long *)std::__cxx11::string::append((char *)&msgType);
  psVar2 = &msgSeqNum.super_SeqNumField.super_FieldBase.m_string;
  pp_Var16 = (_func_int **)(plVar9 + 2);
  if ((_func_int **)*plVar9 == pp_Var16) {
    msgSeqNum.super_SeqNumField.super_FieldBase.m_string._M_dataplus._M_p = (pointer)*pp_Var16;
    msgSeqNum.super_SeqNumField.super_FieldBase.m_string._M_string_length = plVar9[3];
    msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar2;
  }
  else {
    msgSeqNum.super_SeqNumField.super_FieldBase.m_string._M_dataplus._M_p = (pointer)*pp_Var16;
    msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase = (_func_int **)*plVar9;
  }
  msgSeqNum.super_SeqNumField.super_FieldBase._8_8_ = plVar9[1];
  *plVar9 = (long)pp_Var16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar6 = IntField::getValue(&endSeqNo.super_SeqNumField);
  IntConvertor::convert_abi_cxx11_((string *)local_350,(IntConvertor *)(ulong)uVar6,value_00);
  pcVar1 = (char *)(CONCAT44(local_350._12_4_,local_350._8_4_) +
                   msgSeqNum.super_SeqNumField.super_FieldBase._8_8_);
  _Var17._M_p = (char *)0xf;
  if ((string *)msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase != psVar2) {
    _Var17 = msgSeqNum.super_SeqNumField.super_FieldBase.m_string._M_dataplus;
  }
  if (_Var17._M_p < pcVar1) {
    uVar18 = (char *)0xf;
    if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
      uVar18 = local_340._M_allocated_capacity;
    }
    if ((ulong)uVar18 < pcVar1) goto LAB_001a1f9a;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)local_350,0,(char *)0x0,
                         (ulong)msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase);
  }
  else {
LAB_001a1f9a:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&msgSeqNum,local_350._0_8_);
  }
  msg.super_FieldMap._vptr_FieldMap =
       (_func_int **)
       &msg.super_FieldMap.m_fields.
        super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
        super__Vector_impl_data._M_finish;
  pp_Var16 = (_func_int **)(puVar10 + 2);
  if ((_func_int **)*puVar10 == pp_Var16) {
    msg.super_FieldMap.m_fields.super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)*pp_Var16;
    msg.super_FieldMap.m_fields.super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar10[3];
  }
  else {
    msg.super_FieldMap.m_fields.super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)*pp_Var16;
    msg.super_FieldMap._vptr_FieldMap = (_func_int **)*puVar10;
  }
  msg.super_FieldMap.m_fields.super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)puVar10[1];
  *puVar10 = pp_Var16;
  this_00 = &this->m_state;
  puVar10[1] = 0;
  *(undefined1 *)pp_Var16 = 0;
  SessionState::onEvent(this_00,(string *)&msg);
  if ((pointer *)msg.super_FieldMap._vptr_FieldMap !=
      &msg.super_FieldMap.m_fields.
       super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete(msg.super_FieldMap._vptr_FieldMap,
                    (ulong)((long)&(msg.super_FieldMap.m_fields.
                                    super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->_vptr_FieldBase + 1
                           ));
  }
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_,(ulong)(local_340._M_allocated_capacity + 1));
  }
  if ((string *)msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase != psVar2) {
    operator_delete(msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase,
                    (ulong)(msgSeqNum.super_SeqNumField.super_FieldBase.m_string._M_dataplus._M_p +
                           1));
  }
  if ((string *)msgType.super_StringField.super_FieldBase._vptr_FieldBase != psVar15) {
    operator_delete(msgType.super_StringField.super_FieldBase._vptr_FieldBase,
                    (ulong)(msgType.super_StringField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if ((string *)applVerID.super_StringField.super_FieldBase._vptr_FieldBase !=
      &applVerID.super_StringField.super_FieldBase.m_string) {
    operator_delete(applVerID.super_StringField.super_FieldBase._vptr_FieldBase,
                    (ulong)(applVerID.super_StringField.super_FieldBase.m_string._M_dataplus._M_p +
                           1));
  }
  beginString._M_dataplus._M_p = (pointer)&beginString.field_2;
  pcVar3 = (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string._M_dataplus.
           _M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&beginString,pcVar3,
             pcVar3 + (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)&beginString);
  if (((iVar5 < 0) || (iVar5 = IntField::getValue(&endSeqNo.super_SeqNumField), iVar5 != 0)) &&
     ((iVar5 = std::__cxx11::string::compare((char *)&beginString), 0 < iVar5 ||
      (iVar5 = IntField::getValue(&endSeqNo.super_SeqNumField), iVar5 != 999999)))) {
    iVar5 = IntField::getValue(&endSeqNo.super_SeqNumField);
    iVar7 = SessionState::getNextSenderMsgSeqNum(this_00);
    if (iVar5 < iVar7) goto LAB_001a21dd;
  }
  iVar5 = SessionState::getNextSenderMsgSeqNum(this_00);
  IntField::IntField((IntField *)&msg,0x10,iVar5 + -1);
  msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001eefa8;
  endSeqNo.super_SeqNumField.super_FieldBase.m_tag =
       (int)msg.super_FieldMap.m_fields.
            super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_assign((string *)&endSeqNo.super_SeqNumField.super_FieldBase.m_string);
  endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum =
       (int)msg.super_FieldMap.m_order.m_groupOrder.m_size;
  endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._0_4_ =
       msg.super_FieldMap.m_order.m_mode;
  endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._4_4_ =
       msg.super_FieldMap.m_order.m_delim;
  endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_string_length = 0;
  *endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
  FieldBase::~FieldBase((FieldBase *)&msg);
LAB_001a21dd:
  if (this->m_persistMessages == false) {
    iVar5 = IntField::getValue(&endSeqNo.super_SeqNumField);
    IntField::IntField((IntField *)&msg,0x10,iVar5 + 1);
    msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001eefa8;
    psVar15 = &endSeqNo.super_SeqNumField.super_FieldBase.m_string;
    endSeqNo.super_SeqNumField.super_FieldBase.m_tag =
         (int)msg.super_FieldMap.m_fields.
              super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_assign((string *)psVar15);
    endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum =
         (int)msg.super_FieldMap.m_order.m_groupOrder.m_size;
    endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._0_4_ =
         msg.super_FieldMap.m_order.m_mode;
    endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._4_4_ =
         msg.super_FieldMap.m_order.m_delim;
    endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_string_length = 0;
    *endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)&msg);
    iVar5 = SessionState::getNextSenderMsgSeqNum(this_00);
    iVar7 = IntField::getValue(&endSeqNo.super_SeqNumField);
    if (iVar5 < iVar7) {
      IntField::IntField((IntField *)&msg,0x10,iVar5);
      msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001eefa8;
      endSeqNo.super_SeqNumField.super_FieldBase.m_tag =
           (int)msg.super_FieldMap.m_fields.
                super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_assign((string *)psVar15);
      endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum =
           (int)msg.super_FieldMap.m_order.m_groupOrder.m_size;
      endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._0_4_ =
           msg.super_FieldMap.m_order.m_mode;
      endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._4_4_ =
           msg.super_FieldMap.m_order.m_delim;
      endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_string_length = 0;
      *endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
      FieldBase::~FieldBase((FieldBase *)&msg);
    }
    iVar5 = IntField::getValue(&beginSeqNo.super_SeqNumField);
    iVar7 = IntField::getValue(&endSeqNo.super_SeqNumField);
    generateSequenceReset(this,iVar5,iVar7);
  }
  else {
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar5 = IntField::getValue(&beginSeqNo.super_SeqNumField);
    iVar7 = IntField::getValue(&endSeqNo.super_SeqNumField);
    SessionState::get(this_00,iVar5,iVar7,&messages);
    IntField::IntField(&msgSeqNum.super_SeqNumField,0x22,0);
    msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001eee58;
    StringField::StringField(&msgType.super_StringField,0x23);
    msgType.super_StringField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001ed708;
    iVar5 = IntField::getValue(&beginSeqNo.super_SeqNumField);
    messageString._M_dataplus._M_p = (pointer)&messageString.field_2;
    messageString._M_string_length = 0;
    messageString.field_2._M_local_buf[0] = '\0';
    local_490 = messages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (messages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        messages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = false;
      local_4a4 = 0;
    }
    else {
      local_2d0 = &this->m_sessionID;
      local_2e0 = &PTR__FieldBase_001ed588;
      local_4a4 = 0;
      do {
        strMsgType._M_dataplus._M_p = (pointer)&strMsgType.field_2;
        strMsgType._M_string_length = 0;
        strMsgType.field_2._M_local_buf[0] = '\0';
        dataDictionary =
             DataDictionaryProvider::getSessionDataDictionary
                       (&this->m_dataDictionaryProvider,&local_2d0->m_beginString);
        if (dataDictionary->m_storeMsgFieldsOrder == true) {
          std::__cxx11::string::find((char *)local_490,0x1c7dbd,0);
          std::__cxx11::string::find((char)local_490,1);
          std::__cxx11::string::substr((ulong)&msg,(ulong)local_490);
          std::__cxx11::string::operator=((string *)&strMsgType,(string *)&msg);
          if ((pointer *)msg.super_FieldMap._vptr_FieldMap !=
              &msg.super_FieldMap.m_fields.
               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete(msg.super_FieldMap._vptr_FieldMap,
                            (ulong)((long)&(msg.super_FieldMap.m_fields.
                                            super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->
                                           _vptr_FieldBase + 1));
          }
        }
        if ((this->m_sessionID).m_isFIXT == true) {
          Message::Message(&msg);
          Message::setStringHeader(&msg,local_490);
          StringField::StringField((StringField *)&applVerID,0x468);
          applVerID.super_StringField.super_FieldBase._vptr_FieldBase =
               (_func_int **)&PTR__FieldBase_001eefe0;
          bVar4 = FieldMap::getFieldIfSet(&msg.m_header.super_FieldMap,(FieldBase *)&applVerID);
          if (!bVar4) {
            local_350._0_8_ = local_2e0;
            local_350._8_4_ = 0x468;
            local_340._M_allocated_capacity = (size_type)local_330;
            pcVar3 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_350 + 0x10),pcVar3,
                       pcVar3 + (this->m_senderDefaultApplVerID)._M_string_length);
            local_320._M_p = (pointer)&local_310;
            local_318 = 0;
            local_310._M_local_buf[0] = '\0';
            local_300 = 0;
            local_2f8 = 0;
            local_350._0_8_ = &PTR__FieldBase_001eefe0;
            applVerID.super_StringField.super_FieldBase.m_tag = local_350._8_4_;
            std::__cxx11::string::_M_assign
                      ((string *)&applVerID.super_StringField.super_FieldBase.m_string);
            applVerID.super_StringField.super_FieldBase.m_metrics.m_checksum = local_2f8;
            applVerID.super_StringField.super_FieldBase.m_metrics.m_length = local_300;
            applVerID.super_StringField.super_FieldBase.m_data._M_string_length = 0;
            *applVerID.super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
            FieldBase::~FieldBase((FieldBase *)local_350);
          }
          applicationDataDictionary =
               DataDictionaryProvider::getApplicationDataDictionary
                         (&this->m_dataDictionaryProvider,&applVerID);
          if (strMsgType._M_string_length == 0) {
            this_01 = (Message *)operator_new(0x158);
            Message::Message(this_01,local_490,dataDictionary,applicationDataDictionary,
                             this->m_validateLengthAndChecksum);
          }
          else {
            pmVar11 = DataDictionary::getHeaderOrderedFields(dataDictionary);
            local_2d8 = dataDictionary;
            pmVar12 = DataDictionary::getTrailerOrderedFields(dataDictionary);
            pmVar13 = DataDictionary::getMessageOrderedFields(applicationDataDictionary,&strMsgType)
            ;
            this_01 = (Message *)operator_new(0x158);
            Message::Message(this_01,pmVar11,pmVar12,pmVar13,local_490,local_2d8,
                             applicationDataDictionary,this->m_validateLengthAndChecksum);
          }
          FieldBase::~FieldBase((FieldBase *)&applVerID);
          Message::~Message(&msg);
        }
        else if (strMsgType._M_string_length == 0) {
          this_01 = (Message *)operator_new(0x158);
          Message::Message(this_01,local_490,dataDictionary,this->m_validateLengthAndChecksum);
        }
        else {
          pmVar11 = DataDictionary::getHeaderOrderedFields(dataDictionary);
          pmVar12 = DataDictionary::getTrailerOrderedFields(dataDictionary);
          pmVar13 = DataDictionary::getMessageOrderedFields(dataDictionary,&strMsgType);
          this_01 = (Message *)operator_new(0x158);
          Message::Message(this_01,pmVar11,pmVar12,pmVar13,local_490,dataDictionary,
                           this->m_validateLengthAndChecksum);
        }
        FieldMap::getField(&(this_01->m_header).super_FieldMap,(FieldBase *)&msgSeqNum);
        FieldMap::getField(&(this_01->m_header).super_FieldMap,(FieldBase *)&msgType);
        iVar8 = IntField::getValue(&msgSeqNum.super_SeqNumField);
        iVar7 = iVar5;
        if (local_4a4 != 0) {
          iVar7 = local_4a4;
        }
        if (iVar5 != iVar8) {
          local_4a4 = iVar7;
        }
        if (((msgType.super_StringField.super_FieldBase.m_string._M_string_length == 1) &&
            (pvVar14 = memchr("0A12345",
                              (int)*msgType.super_StringField.super_FieldBase.m_string._M_dataplus.
                                    _M_p,8), pvVar14 != (void *)0x0)) ||
           (bVar4 = resend(this,this_01), !bVar4)) {
          if (local_4a4 == 0) {
            local_4a4 = IntField::getValue(&msgSeqNum.super_SeqNumField);
          }
          bVar4 = false;
        }
        else {
          if (local_4a4 != 0) {
            iVar5 = IntField::getValue(&msgSeqNum.super_SeqNumField);
            generateSequenceReset(this,local_4a4,iVar5);
          }
          psVar15 = Message::toString(this_01,&messageString,8,9,10);
          if (this->m_pResponder != (Responder *)0x0) {
            SessionState::onOutgoing(this_00,psVar15);
            (*this->m_pResponder->_vptr_Responder[2])(this->m_pResponder,psVar15);
          }
          uVar6 = IntField::getValue(&msgSeqNum.super_SeqNumField);
          IntConvertor::convert_abi_cxx11_
                    ((string *)&applVerID,(IntConvertor *)(ulong)uVar6,value_01);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&applVerID,0,(char *)0x0,0x1c7dc2);
          msg.super_FieldMap._vptr_FieldMap =
               (_func_int **)
               &msg.super_FieldMap.m_fields.
                super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                super__Vector_impl_data._M_finish;
          pp_Var16 = (_func_int **)(plVar9 + 2);
          if ((_func_int **)*plVar9 == pp_Var16) {
            msg.super_FieldMap.m_fields.
            super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*pp_Var16;
            msg.super_FieldMap.m_fields.
            super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)plVar9[3];
          }
          else {
            msg.super_FieldMap.m_fields.
            super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)*pp_Var16;
            msg.super_FieldMap._vptr_FieldMap = (_func_int **)*plVar9;
          }
          msg.super_FieldMap.m_fields.
          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)plVar9[1];
          *plVar9 = (long)pp_Var16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          SessionState::onEvent(this_00,(string *)&msg);
          if ((pointer *)msg.super_FieldMap._vptr_FieldMap !=
              &msg.super_FieldMap.m_fields.
               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete(msg.super_FieldMap._vptr_FieldMap,
                            (ulong)((long)&(msg.super_FieldMap.m_fields.
                                            super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->
                                           _vptr_FieldBase + 1));
          }
          if ((string *)applVerID.super_StringField.super_FieldBase._vptr_FieldBase !=
              &applVerID.super_StringField.super_FieldBase.m_string) {
            operator_delete(applVerID.super_StringField.super_FieldBase._vptr_FieldBase,
                            (ulong)(applVerID.super_StringField.super_FieldBase.m_string._M_dataplus
                                    ._M_p + 1));
          }
          local_4a4 = 0;
          bVar4 = true;
        }
        iVar5 = IntField::getValue(&msgSeqNum.super_SeqNumField);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strMsgType._M_dataplus._M_p != &strMsgType.field_2) {
          operator_delete(strMsgType._M_dataplus._M_p,
                          CONCAT71(strMsgType.field_2._M_allocated_capacity._1_7_,
                                   strMsgType.field_2._M_local_buf[0]) + 1);
        }
        iVar5 = iVar5 + 1;
        (*(this_01->super_FieldMap)._vptr_FieldMap[1])(this_01);
        local_490 = local_490 + 1;
      } while (local_490 !=
               messages.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_4a4 != 0) {
      iVar5 = IntField::getValue(&msgSeqNum.super_SeqNumField);
      generateSequenceReset(this,local_4a4,iVar5 + 1);
    }
    iVar5 = IntField::getValue(&endSeqNo.super_SeqNumField);
    iVar7 = IntField::getValue(&msgSeqNum.super_SeqNumField);
    if (iVar7 < iVar5) {
      iVar5 = IntField::getValue(&endSeqNo.super_SeqNumField);
      IntField::IntField((IntField *)&msg,0x10,iVar5 + 1);
      msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001eefa8;
      psVar15 = &endSeqNo.super_SeqNumField.super_FieldBase.m_string;
      endSeqNo.super_SeqNumField.super_FieldBase.m_tag =
           (int)msg.super_FieldMap.m_fields.
                super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_assign((string *)psVar15);
      endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum =
           (int)msg.super_FieldMap.m_order.m_groupOrder.m_size;
      endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._0_4_ =
           msg.super_FieldMap.m_order.m_mode;
      endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._4_4_ =
           msg.super_FieldMap.m_order.m_delim;
      endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_string_length = 0;
      *endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
      FieldBase::~FieldBase((FieldBase *)&msg);
      iVar5 = SessionState::getNextSenderMsgSeqNum(this_00);
      iVar7 = IntField::getValue(&endSeqNo.super_SeqNumField);
      if (iVar5 < iVar7) {
        IntField::IntField((IntField *)&msg,0x10,iVar5);
        msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001eefa8;
        endSeqNo.super_SeqNumField.super_FieldBase.m_tag =
             (int)msg.super_FieldMap.m_fields.
                  super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_assign((string *)psVar15);
        endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum =
             (int)msg.super_FieldMap.m_order.m_groupOrder.m_size;
        endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._0_4_ =
             msg.super_FieldMap.m_order.m_mode;
        endSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._4_4_ =
             msg.super_FieldMap.m_order.m_delim;
        endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_string_length = 0;
        *endSeqNo.super_SeqNumField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
        FieldBase::~FieldBase((FieldBase *)&msg);
      }
      if (bVar4) {
        iVar5 = IntField::getValue(&msgSeqNum.super_SeqNumField);
        IntField::IntField((IntField *)&msg,7,iVar5 + 1);
        msg.super_FieldMap._vptr_FieldMap = local_2f0;
        beginSeqNo.super_SeqNumField.super_FieldBase.m_tag =
             (int)msg.super_FieldMap.m_fields.
                  super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_assign
                  ((string *)&beginSeqNo.super_SeqNumField.super_FieldBase.m_string);
        beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_checksum =
             (int)msg.super_FieldMap.m_order.m_groupOrder.m_size;
        beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._0_4_ =
             msg.super_FieldMap.m_order.m_mode;
        beginSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length._4_4_ =
             msg.super_FieldMap.m_order.m_delim;
        beginSeqNo.super_SeqNumField.super_FieldBase.m_data._M_string_length = 0;
        *beginSeqNo.super_SeqNumField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
        FieldBase::~FieldBase((FieldBase *)&msg);
      }
      iVar5 = IntField::getValue(&beginSeqNo.super_SeqNumField);
      iVar7 = IntField::getValue(&endSeqNo.super_SeqNumField);
      generateSequenceReset(this,iVar5,iVar7);
    }
    FieldMap::getField(&(local_2e8->m_header).super_FieldMap,(FieldBase *)&msgSeqNum);
    iVar5 = IntField::getValue(&msgSeqNum.super_SeqNumField);
    iVar7 = SessionState::getNextTargetMsgSeqNum(this_00);
    if (iVar5 <= iVar7) {
      iVar5 = IntField::getValue(&msgSeqNum.super_SeqNumField);
      iVar7 = SessionState::getNextTargetMsgSeqNum(this_00);
      if (iVar7 <= iVar5) {
        SessionState::incrNextTargetMsgSeqNum(this_00);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)messageString._M_dataplus._M_p != &messageString.field_2) {
      operator_delete(messageString._M_dataplus._M_p,
                      CONCAT71(messageString.field_2._M_allocated_capacity._1_7_,
                               messageString.field_2._M_local_buf[0]) + 1);
    }
    FieldBase::~FieldBase((FieldBase *)&msgType);
    FieldBase::~FieldBase((FieldBase *)&msgSeqNum);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&messages);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)beginString._M_dataplus._M_p != &beginString.field_2) {
    operator_delete(beginString._M_dataplus._M_p,beginString.field_2._M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase((FieldBase *)&endSeqNo);
  FieldBase::~FieldBase((FieldBase *)&beginSeqNo);
  iVar5 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar5 + -1;
  if (iVar5 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return;
}

Assistant:

void Session::nextResendRequest( const Message& resendRequest, const UtcTimeStamp& timeStamp )
{
  if ( !verify( resendRequest, false, false ) ) return ;

  Locker l( m_mutex );

  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  resendRequest.getField( beginSeqNo );
  resendRequest.getField( endSeqNo );

  m_state.onEvent( "Received ResendRequest FROM: "
       + IntConvertor::convert( beginSeqNo ) +
                   " TO: " + IntConvertor::convert( endSeqNo ) );

  std::string beginString = m_sessionID.getBeginString();
  if ( (beginString >= FIX::BeginString_FIX42 && endSeqNo == 0) ||
       (beginString <= FIX::BeginString_FIX42 && endSeqNo == 999999) ||
       (endSeqNo >= getExpectedSenderNum()) )
  { endSeqNo = getExpectedSenderNum() - 1; }

  if ( !m_persistMessages )
  {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    int next = m_state.getNextSenderMsgSeqNum();
    if( endSeqNo > next )
      endSeqNo = EndSeqNo(next);
    generateSequenceReset( beginSeqNo, endSeqNo );
    return;
  }

  std::vector < std::string > messages;
  m_state.get( beginSeqNo, endSeqNo, messages );

  std::vector < std::string > ::iterator i;
  MsgSeqNum msgSeqNum(0);
  MsgType msgType;
  int begin = 0;
  int current = beginSeqNo;
  bool appMessageJustSent = false;
  std::string messageString;

  for ( i = messages.begin(); i != messages.end(); ++i )
  {
    appMessageJustSent = false;
    SmartPtr<FIX::Message> pMsg;
    std::string strMsgType;
    const DataDictionary& sessionDD =
      m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if (sessionDD.isMessageFieldsOrderPreserved())
    {
      std::string::size_type equalSign = (*i).find("\00135=");
      equalSign += 4;
      std::string::size_type soh = (*i).find_first_of('\001', equalSign);
      strMsgType = (*i).substr(equalSign, soh - equalSign);
#ifdef HAVE_EMX
      if (FIX::Message::isAdminMsgType(strMsgType) == false)
      {
        equalSign = (*i).find("\0019426=", soh);
        if (equalSign == std::string::npos)
          throw FIX::IOException("EMX message type (9426) not found");

        equalSign += 6;
        soh = (*i).find_first_of('\001', equalSign);
        if (soh == std::string::npos)
          throw FIX::IOException("EMX message type (9426) soh char not found");
        strMsgType.assign((*i).substr(equalSign, soh - equalSign));
      }
#endif
    }

    if( m_sessionID.isFIXT() )
    {
      Message msg;
      msg.setStringHeader(*i);
      ApplVerID applVerID;
      if( !msg.getHeader().getFieldIfSet(applVerID) )
        applVerID = m_senderDefaultApplVerID;

      const DataDictionary& applicationDD =
          m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      if (strMsgType.empty())
        pMsg.reset( new Message( *i, sessionDD, applicationDD, m_validateLengthAndChecksum ));
      else
      {
        const message_order & headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order & trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order & messageOrder = applicationDD.getMessageOrderedFields(strMsgType);
        pMsg.reset( new Message( headerOrder, trailerOrder, messageOrder, *i, sessionDD, applicationDD, m_validateLengthAndChecksum ));
      }
    }
    else
    {
      if (strMsgType.empty())
        pMsg.reset( new Message( *i, sessionDD, m_validateLengthAndChecksum ));
      else
      {
        const message_order & headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order & trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order & messageOrder = sessionDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(headerOrder, trailerOrder, messageOrder, *i, sessionDD, m_validateLengthAndChecksum ));
      }
    }

    Message & msg = *pMsg;

    msg.getHeader().getField( msgSeqNum );
    msg.getHeader().getField( msgType );

    if( (current != msgSeqNum) && !begin )
      begin = current;

    if ( Message::isAdminMsgType( msgType ) )
    {
      if ( !begin ) begin = msgSeqNum;
    }
    else
    {
      if ( resend( msg ) )
      {
        if ( begin ) generateSequenceReset( begin, msgSeqNum );
        send( msg.toString(messageString) );
        m_state.onEvent( "Resending Message: "
                         + IntConvertor::convert( msgSeqNum ) );
        begin = 0;
        appMessageJustSent = true;
      }
      else
      { if ( !begin ) begin = msgSeqNum; }
    }
    current = msgSeqNum + 1;
  }
  if ( begin )
  {
    generateSequenceReset( begin, msgSeqNum + 1 );
  }

  if ( endSeqNo > msgSeqNum )
  {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    int next = m_state.getNextSenderMsgSeqNum();
    if( endSeqNo > next )
      endSeqNo = EndSeqNo(next);
    if ( appMessageJustSent )
      beginSeqNo = msgSeqNum + 1;
    generateSequenceReset( beginSeqNo, endSeqNo );
  }

  resendRequest.getHeader().getField( msgSeqNum );
  if( !isTargetTooHigh(msgSeqNum) && !isTargetTooLow(msgSeqNum) )
    m_state.incrNextTargetMsgSeqNum();
}